

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O1

void tcg_gen_dup32i_vec_sparc(TCGContext_conflict7 *tcg_ctx,TCGv_vec r,uint32_t a)

{
  uint uVar1;
  TCGOp *pTVar2;
  
  uVar1 = *(uint *)(r + (long)&tcg_ctx->pool_cur);
  pTVar2 = tcg_emit_op_sparc(tcg_ctx,INDEX_op_dupi_vec);
  *(uint *)pTVar2 = (*(uint *)pTVar2 & 0xffff00ff) + ((uVar1 >> 8) + 0xe00 & 0xf00) + 0x3000;
  pTVar2->args[0] = (TCGArg)(r + (long)&tcg_ctx->pool_cur);
  pTVar2->args[1] = CONCAT44(a,a);
  return;
}

Assistant:

void tcg_gen_dup32i_vec(TCGContext *tcg_ctx, TCGv_vec r, uint32_t a)
{
    do_dupi_vec(tcg_ctx, r, MO_REG, dup_const(MO_32, a));
}